

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::setBasis(Highs *this,HighsBasis *basis,string *origin)

{
  HighsModel *lp;
  uint uVar1;
  pointer pHVar2;
  pointer pHVar3;
  bool bVar4;
  HighsStatus HVar5;
  ulong uVar6;
  ulong uVar7;
  HighsBasisStatus HVar8;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 uVar9;
  HighsBasis modifiable_basis;
  HighsLpSolverObject solver_object;
  
  uVar9 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  lp = &this->model_;
  if (basis->alien == true) {
    if ((this->model_).lp_.num_row_ != 0) {
      bVar4 = isBasisRightSize(&lp->lp_,basis);
      if (bVar4) {
        HighsBasis::HighsBasis(&modifiable_basis,basis);
        modifiable_basis.was_alien = true;
        solver_object.solution_ = &this->solution_;
        solver_object.highs_info_ = &this->info_;
        solver_object.ekk_instance_ = &this->ekk_instance_;
        solver_object.callback_ = &this->callback_;
        solver_object.options_ = &this->options_;
        solver_object.timer_ = &this->timer_;
        solver_object.model_status_ = kMin;
        solver_object.lp_ = &lp->lp_;
        solver_object.basis_ = &modifiable_basis;
        HVar5 = formSimplexLpBasisAndFactor(&solver_object,false);
        if (HVar5 == kOk) {
          HighsBasis::operator=(&this->basis_,&modifiable_basis);
          HighsBasis::~HighsBasis(&modifiable_basis);
          goto LAB_00237823;
        }
        HighsBasis::~HighsBasis(&modifiable_basis);
      }
      else {
        highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                     "setBasis: User basis is rejected due to mismatch between size of column and row status vectors (%d, %d) and number of columns and rows in the model (%d, %d)\n"
                     ,(ulong)(uint)(*(int *)&(this->basis_).col_status.
                                             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                   *(int *)&(this->basis_).col_status.
                                            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                                            ._M_impl.super__Vector_impl_data._M_start),
                     (ulong)(uint)(*(int *)&(this->basis_).row_status.
                                            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                  *(int *)&(this->basis_).row_status.
                                           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                                           ._M_impl.super__Vector_impl_data._M_start),
                     (ulong)(uint)(this->model_).lp_.num_col_,
                     CONCAT44(uVar9,(this->model_).lp_.num_row_));
      }
      return kError;
    }
    uVar1 = (this->model_).lp_.num_col_;
    pHVar2 = (basis->col_status).
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    pHVar3 = (this->basis_).col_status.
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      HVar8 = pHVar2[uVar7];
      if (HVar8 == kBasic) {
        HVar8 = kNonbasic;
      }
      pHVar3[uVar7] = HVar8;
    }
    (this->basis_).alien = false;
  }
  else {
    bVar4 = isBasisConsistent(&lp->lp_,basis);
    if (!bVar4) {
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                   "setBasis: invalid basis\n");
      return kError;
    }
    HighsBasis::operator=(&this->basis_,basis);
  }
LAB_00237823:
  (this->basis_).valid = true;
  (this->basis_).useful = true;
  bVar4 = std::operator!=(origin,"");
  if (bVar4) {
    std::__cxx11::string::_M_assign((string *)&(this->basis_).debug_origin_name);
  }
  if ((this->basis_).was_alien == true) {
    highsBoolToString_abi_cxx11_((string *)&modifiable_basis,true,2);
    highsLogDev(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                "Highs::setBasis Was alien = %-5s; Id = %9d; UpdateCount = %4d; Origin (%s)\n",
                CONCAT44(modifiable_basis.debug_id,modifiable_basis._0_4_),
                (ulong)(uint)(this->basis_).debug_id,(ulong)(uint)(this->basis_).debug_update_count,
                (this->basis_).debug_origin_name._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&modifiable_basis);
  }
  newHighsBasis(this);
  return kOk;
}

Assistant:

HighsStatus Highs::setBasis(const HighsBasis& basis,
                            const std::string& origin) {
  if (basis.alien) {
    // An alien basis needs to be checked properly, since it may be
    // singular, or even incomplete.
    if (model_.lp_.num_row_ == 0) {
      // Special case where there are no rows, so no singularity
      // issues. All columns with basic status must be set nonbasic
      for (HighsInt iCol = 0; iCol < model_.lp_.num_col_; iCol++)
        basis_.col_status[iCol] =
            basis.col_status[iCol] == HighsBasisStatus::kBasic
                ? HighsBasisStatus::kNonbasic
                : basis.col_status[iCol];
      basis_.alien = false;
    } else {
      // Check whether a new basis can be defined
      if (!isBasisRightSize(model_.lp_, basis)) {
        highsLogUser(
            options_.log_options, HighsLogType::kError,
            "setBasis: User basis is rejected due to mismatch between "
            "size of column and row status vectors (%d, %d) and number "
            "of columns and rows in the model (%d, %d)\n",
            int(basis_.col_status.size()), int(basis_.row_status.size()),
            int(model_.lp_.num_col_), int(model_.lp_.num_row_));
        return HighsStatus::kError;
      }
      HighsBasis modifiable_basis = basis;
      modifiable_basis.was_alien = true;
      HighsLpSolverObject solver_object(model_.lp_, modifiable_basis, solution_,
                                        info_, ekk_instance_, callback_,
                                        options_, timer_);
      HighsStatus return_status = formSimplexLpBasisAndFactor(solver_object);
      if (return_status != HighsStatus::kOk) return HighsStatus::kError;
      // Update the HiGHS basis
      basis_ = std::move(modifiable_basis);
    }
  } else {
    // Check the user-supplied basis
    if (!isBasisConsistent(model_.lp_, basis)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "setBasis: invalid basis\n");
      return HighsStatus::kError;
    }
    // Update the HiGHS basis
    basis_ = basis;
  }
  basis_.valid = true;
  basis_.useful = true;
  if (origin != "") basis_.debug_origin_name = origin;
  assert(basis_.debug_origin_name != "");
  assert(!basis_.alien);
  if (basis_.was_alien) {
    highsLogDev(
        options_.log_options, HighsLogType::kInfo,
        "Highs::setBasis Was alien = %-5s; Id = %9d; UpdateCount = %4d; Origin "
        "(%s)\n",
        highsBoolToString(basis_.was_alien).c_str(), (int)basis_.debug_id,
        (int)basis_.debug_update_count, basis_.debug_origin_name.c_str());
  }

  // Follow implications of a new HiGHS basis
  newHighsBasis();
  // Can't use returnFromHighs since...
  return HighsStatus::kOk;
}